

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int udp_output(char *buf,int len,NMQ *kcp,void *user)

{
  int in_R8D;
  undefined4 local_30;
  anon_union_8_2_743ac376 parameter;
  void *user_local;
  NMQ *kcp_local;
  int len_local;
  char *buf_local;
  
  if (len < 0) {
    if (len == -1) {
      g_done = 1;
    }
  }
  else {
    local_30 = (int)user;
    LatencySimulator::send(vnet,local_30,buf,(ulong)(uint)len,in_R8D);
  }
  return 0;
}

Assistant:

int udp_output(const char *buf, const int len, NMQ *kcp, void *user)
{
	union { int id; void *ptr; } parameter;
//	fprintf(stderr, "udp_output: source: %ld, data: %p, len: %d\n", (long)user, buf, len);
	parameter.ptr = user;
    if (len >= 0) {
        vnet->send(parameter.id, buf, len);
    } else if (len == NMQ_SEND_EOF) {
//        fprintf(stderr, "udp_output: source %ld  eof.\n", (long)user);
        g_done = 1;
    }
	return 0;
}